

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  int in_EAX;
  size_t sVar1;
  u8 *in_R9;
  double value;
  
  if (z != (char *)0x0) {
    sVar1 = strlen(z);
    sqlite3AtoF(z,(double *)&stack0xffffffffffffffd8,(uint)sVar1 & 0x3fffffff,'\x01');
    sqlite3VdbeAddOp4Dup8(v,0x99,iMem,(int)&stack0xffffffffffffffd8,-0xc,in_R9,in_EAX);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}